

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview_p.h
# Opt level: O0

void __thiscall
QColumnViewPreviewColumn::resizeEvent(QColumnViewPreviewColumn *this,QResizeEvent *event)

{
  int *piVar1;
  QScrollBar *this_00;
  QScrollBar *pQVar2;
  QResizeEvent *in_RSI;
  QAbstractScrollArea *in_RDI;
  long in_FS_OFFSET;
  QSize v;
  QSize p;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QWidget *this_01;
  int h;
  int in_stack_ffffffffffffff9c;
  QWidget *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x28) != 0) {
    this_01 = *(QWidget **)(in_RDI + 0x28);
    local_c = QWidget::minimumWidth(this_01);
    QResizeEvent::size(in_RSI);
    local_10 = QSize::width((QSize *)0x8681b3);
    piVar1 = qMax<int>(&local_c,&local_10);
    h = *piVar1;
    QWidget::height((QWidget *)0x8681dd);
    QWidget::resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,h);
    QAbstractScrollArea::viewport((QAbstractScrollArea *)this_01);
    QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    this_00 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
    QSize::width((QSize *)0x86824b);
    QSize::width((QSize *)0x868259);
    QAbstractSlider::setRange
              (&this_00->super_QAbstractSlider,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (int)in_stack_ffffffffffffffa8);
    pQVar2 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_01);
    QSize::width((QSize *)0x868284);
    QAbstractSlider::setPageStep((QAbstractSlider *)this_01,in_stack_ffffffffffffff8c);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_01);
    QSize::height((QSize *)0x8682a9);
    QSize::height((QSize *)0x8682b7);
    QAbstractSlider::setRange
              (&this_00->super_QAbstractSlider,(int)((ulong)pQVar2 >> 0x20),(int)pQVar2);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_01);
    QSize::height((QSize *)0x8682e2);
    QAbstractSlider::setPageStep((QAbstractSlider *)this_01,in_stack_ffffffffffffff8c);
    QAbstractScrollArea::resizeEvent(in_RDI,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void resizeEvent(QResizeEvent * event) override{
        if (!previewWidget)
            return;
        previewWidget->resize(
                qMax(previewWidget->minimumWidth(), event->size().width()),
                previewWidget->height());
        QSize p = viewport()->size();
        QSize v = previewWidget->size();
        horizontalScrollBar()->setRange(0, v.width() - p.width());
        horizontalScrollBar()->setPageStep(p.width());
        verticalScrollBar()->setRange(0, v.height() - p.height());
        verticalScrollBar()->setPageStep(p.height());

        QAbstractScrollArea::resizeEvent(event);
    }